

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynBase * ParseTerminalType(ParseContext *ctx,bool *shrBorrow)

{
  Lexeme *begin;
  _func_int **pp_Var1;
  SynBase *pSVar2;
  SynBase *pSVar3;
  SynIdentifier *pSVar4;
  bool *shrBorrow_00;
  bool bVar5;
  int iVar6;
  LexemeType LVar7;
  undefined4 extraout_var;
  undefined **ppuVar8;
  undefined4 extraout_var_00;
  SynBase *pSVar9;
  undefined4 extraout_var_01;
  SynBase *pSVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SynNamespaceElement *parent;
  SynIdentifier *pSVar11;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  uint uVar12;
  Lexeme *pLVar13;
  Lexeme *pLVar14;
  Lexeme *pLVar15;
  InplaceStr name;
  IntrusiveList<SynBase> types;
  IntrusiveList<SynIdentifier> namespacePath;
  IntrusiveList<SynBase> local_58;
  IntrusiveList<SynIdentifier> local_48;
  bool *local_38;
  undefined4 extraout_var_02;
  undefined4 extraout_var_05;
  
  begin = ctx->currentLexeme;
  LVar7 = begin->type;
  if ((int)LVar7 < 0x45) {
    local_38 = shrBorrow;
    if (LVar7 == lex_string) {
      pLVar14 = (Lexeme *)begin->pos;
      uVar12 = begin->length;
      ctx->currentLexeme = begin + 1;
      pLVar15 = (Lexeme *)((long)&pLVar14->type + (ulong)uVar12);
      local_48.head = (SynIdentifier *)0x0;
      local_48.tail = (SynIdentifier *)0x0;
      if (begin[1].type == lex_point) {
        parent = (SynNamespaceElement *)0x0;
        do {
          name.end = (char *)pLVar15;
          name.begin = (char *)pLVar14;
          parent = ParseContext::IsNamespace(ctx,parent,name);
          if (parent == (SynNamespaceElement *)0x0) break;
          if (ctx->currentLexeme->type != lex_none) {
            ctx->currentLexeme = ctx->currentLexeme + 1;
          }
          bVar5 = anon_unknown.dwarf_151f2::CheckAt
                            (ctx,lex_string,"ERROR: namespace member is expected after \'.\'");
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar11 = (SynIdentifier *)CONCAT44(extraout_var_05,iVar6);
          pLVar13 = ctx->currentLexeme;
          if (!bVar5) {
            if (pLVar13 <= ctx->firstLexeme) goto LAB_0011356f;
            SynBase::SynBase((SynBase *)pSVar11,4,begin,pLVar13 + -1);
            (pSVar11->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0c0;
            (pSVar11->name).begin = (char *)pLVar14;
            (pSVar11->name).end = (char *)pLVar15;
            IntrusiveList<SynIdentifier>::push_back(&local_48,pSVar11);
            break;
          }
          if (pLVar13 <= ctx->firstLexeme) goto LAB_0011356f;
          SynBase::SynBase((SynBase *)pSVar11,4,begin,pLVar13 + -1);
          (pSVar11->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0c0;
          (pSVar11->name).begin = (char *)pLVar14;
          (pSVar11->name).end = (char *)pLVar15;
          IntrusiveList<SynIdentifier>::push_back(&local_48,pSVar11);
          pLVar13 = ctx->currentLexeme;
          pLVar14 = (Lexeme *)pLVar13->pos;
          uVar12 = pLVar13->length;
          if (pLVar13->type == lex_none) {
            pLVar15 = (Lexeme *)((long)&pLVar14->type + (ulong)uVar12);
            break;
          }
          ctx->currentLexeme = pLVar13 + 1;
          pLVar15 = (Lexeme *)((long)&pLVar14->type + (ulong)uVar12);
        } while (pLVar13[1].type == lex_point);
      }
      shrBorrow_00 = local_38;
      if (ctx->currentLexeme->type == lex_less) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        local_58.head = (SynBase *)0x0;
        local_58.tail = (SynBase *)0x0;
        pSVar9 = ParseType(ctx,local_38,false);
        if (pSVar9 == (SynBase *)0x0) {
          if (ctx->currentLexeme->type == lex_greater) {
            anon_unknown.dwarf_151f2::Report
                      (ctx,ctx->currentLexeme,"ERROR: typename required after \'<\'");
          }
          goto LAB_00113554;
        }
        IntrusiveList<SynBase>::push_back(&local_58,pSVar9);
        pLVar13 = ctx->currentLexeme;
        LVar7 = pLVar13->type;
        if (LVar7 == lex_comma) {
          do {
            ctx->currentLexeme = pLVar13 + 1;
            pSVar9 = ParseType(ctx,shrBorrow_00,false);
            if (pSVar9 == (SynBase *)0x0) {
              anon_unknown.dwarf_151f2::Report
                        (ctx,ctx->currentLexeme,"ERROR: typename required after \',\'");
              pLVar13 = ctx->currentLexeme;
              LVar7 = pLVar13->type;
              break;
            }
            IntrusiveList<SynBase>::push_back(&local_58,pSVar9);
            pLVar13 = ctx->currentLexeme;
            LVar7 = pLVar13->type;
          } while (LVar7 == lex_comma);
        }
        if (LVar7 == lex_shr) {
          bVar5 = *shrBorrow_00;
          if (bVar5 == true) {
            ctx->currentLexeme = pLVar13 + 1;
          }
          *shrBorrow_00 = (bool)(bVar5 ^ 1);
        }
        else if (LVar7 == lex_greater) {
          ctx->currentLexeme = pLVar13 + 1;
        }
        else {
          if (local_58.head == (SynBase *)0x0) {
LAB_00113554:
            ctx->currentLexeme = begin;
            return (SynBase *)0x0;
          }
          uVar12 = 0;
          pSVar9 = local_58.head;
          do {
            uVar12 = uVar12 + 1;
            pSVar9 = pSVar9->next;
          } while (pSVar9 != (SynBase *)0x0);
          if (uVar12 < 2) goto LAB_00113554;
          anon_unknown.dwarf_151f2::Report
                    (ctx,pLVar13,"ERROR: \'>\' expected after generic type alias list");
        }
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
        pSVar9 = (SynBase *)CONCAT44(extraout_var_07,iVar6);
        pLVar13 = ctx->currentLexeme;
        if (ctx->firstLexeme < pLVar13) {
          iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
          pSVar4 = local_48.tail;
          pSVar11 = local_48.head;
          pSVar10 = (SynBase *)CONCAT44(extraout_var_08,iVar6);
          if (ctx->firstLexeme < ctx->currentLexeme) {
            SynBase::SynBase(pSVar10,7,begin,ctx->currentLexeme + -1);
            pSVar3 = local_58.tail;
            pSVar2 = local_58.head;
            pSVar10->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f128;
            pSVar10[1]._vptr_SynBase = (_func_int **)pSVar11;
            *(SynIdentifier **)&pSVar10[1].typeID = pSVar4;
            pSVar10[1].begin = pLVar14;
            pSVar10[1].end = pLVar15;
            SynBase::SynBase(pSVar9,0xc,begin,pLVar13 + -1);
            pSVar9->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f160;
            pSVar9[1]._vptr_SynBase = (_func_int **)pSVar10;
            *(SynBase **)&pSVar9[1].typeID = pSVar2;
            pSVar9[1].begin = (Lexeme *)pSVar3;
            return pSVar9;
          }
        }
      }
      else {
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
        pSVar4 = local_48.tail;
        pSVar11 = local_48.head;
        pSVar9 = (SynBase *)CONCAT44(extraout_var_06,iVar6);
        if (ctx->firstLexeme < ctx->currentLexeme) {
          SynBase::SynBase(pSVar9,7,begin,ctx->currentLexeme + -1);
          pSVar9->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f128;
          pSVar9[1]._vptr_SynBase = (_func_int **)pSVar11;
          *(SynIdentifier **)&pSVar9[1].typeID = pSVar4;
          pSVar9[1].begin = pLVar14;
          pSVar9[1].end = pLVar15;
          return pSVar9;
        }
      }
    }
    else {
      if (LVar7 != lex_auto) {
        return (SynBase *)0x0;
      }
      ctx->currentLexeme = begin + 1;
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pSVar9 = (SynBase *)CONCAT44(extraout_var_00,iVar6);
      if (ctx->firstLexeme < ctx->currentLexeme) {
        SynBase::SynBase(pSVar9,5,begin,ctx->currentLexeme + -1);
        ppuVar8 = &PTR__SynBase_0023f198;
LAB_00112fa4:
        pSVar9->_vptr_SynBase = (_func_int **)ppuVar8;
        return pSVar9;
      }
    }
  }
  else if (LVar7 == lex_typeof) {
    ctx->currentLexeme = begin + 1;
    anon_unknown.dwarf_151f2::CheckConsume(ctx,lex_oparen,"ERROR: typeof must be followed by \'(\'")
    ;
    pSVar9 = ParseAssignment(ctx);
    if (pSVar9 == (SynBase *)0x0) {
      anon_unknown.dwarf_151f2::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after typeof(");
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar9 = (SynBase *)CONCAT44(extraout_var_01,iVar6);
      SynBase::SynBase(pSVar9,0,ctx->currentLexeme,ctx->currentLexeme);
      pSVar9->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f208;
    }
    anon_unknown.dwarf_151f2::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' not found after expression in typeof");
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pSVar10 = (SynBase *)CONCAT44(extraout_var_02,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar10,0xd,begin,ctx->currentLexeme + -1);
      pSVar10->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f240;
      pSVar10[1]._vptr_SynBase = (_func_int **)pSVar9;
      pSVar9 = ParsePostExpressions(ctx,pSVar10);
      return pSVar9;
    }
  }
  else if (LVar7 == lex_at) {
    ctx->currentLexeme = begin + 1;
    if (begin[1].type != lex_string) goto LAB_00113554;
    pp_Var1 = (_func_int **)begin[1].pos;
    uVar12 = begin[1].length;
    ctx->currentLexeme = begin + 2;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pSVar9 = (SynBase *)CONCAT44(extraout_var_03,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      pLVar14 = ctx->currentLexeme + -1;
      SynBase::SynBase(pSVar9,4,pLVar14,pLVar14);
      pSVar9->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0c0;
      pSVar9[1]._vptr_SynBase = pp_Var1;
      *(char **)&pSVar9[1].typeID = (char *)((long)pp_Var1 + (ulong)uVar12);
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pSVar10 = (SynBase *)CONCAT44(extraout_var_04,iVar6);
      if (ctx->firstLexeme < ctx->currentLexeme) {
        SynBase::SynBase(pSVar10,8,begin,ctx->currentLexeme + -1);
        pSVar10->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f278;
        pSVar10[1]._vptr_SynBase = (_func_int **)pSVar9;
        return pSVar10;
      }
    }
  }
  else {
    if (LVar7 != lex_generic) {
      return (SynBase *)0x0;
    }
    ctx->currentLexeme = begin + 1;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pSVar9 = (SynBase *)CONCAT44(extraout_var,iVar6);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      SynBase::SynBase(pSVar9,6,begin,ctx->currentLexeme + -1);
      ppuVar8 = &PTR__SynBase_0023f1d0;
      goto LAB_00112fa4;
    }
  }
LAB_0011356f:
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynBase* ParseTerminalType(ParseContext &ctx, bool &shrBorrow)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();

		IntrusiveList<SynIdentifier> namespacePath;

		SynNamespaceElement *ns = NULL;

		while(ctx.At(lex_point) && (ns = ctx.IsNamespace(ns, name)) != NULL)
		{
			ctx.Skip();

			if(!CheckAt(ctx, lex_string, "ERROR: namespace member is expected after '.'"))
			{
				namespacePath.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), name));

				break;
			}

			namespacePath.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), name));

			name = ctx.Consume();
		}

		if(ctx.Consume(lex_less))
		{
			IntrusiveList<SynBase> types;

			SynBase *type = ParseType(ctx, &shrBorrow);

			if(!type)
			{
				if(ctx.Peek() == lex_greater)
					Report(ctx, ctx.Current(), "ERROR: typename required after '<'");

				// Backtrack
				ctx.currentLexeme = start;

				return NULL;
			}

			types.push_back(type);

			while(ctx.Consume(lex_comma))
			{
				type = ParseType(ctx, &shrBorrow);

				if(!type)
				{
					Report(ctx, ctx.Current(), "ERROR: typename required after ','");

					break;
				}

				types.push_back(type);
			}

			bool closed = ctx.Consume(lex_greater);

			if(!closed && ctx.At(lex_shr))
			{
				if(shrBorrow)
					ctx.Skip();

				shrBorrow = !shrBorrow;

				closed = true;
			}

			if(!closed)
			{
				if(types.size() > 1)
				{
					Report(ctx, ctx.Current(), "ERROR: '>' expected after generic type alias list");
				}
				else
				{
					// Backtrack
					ctx.currentLexeme = start;

					return NULL;
				}
			}

			return new (ctx.get<SynTypeGenericInstance>()) SynTypeGenericInstance(start, ctx.Previous(), new (ctx.get<SynTypeSimple>()) SynTypeSimple(start, ctx.Previous(), namespacePath, name), types);
		}

		return new (ctx.get<SynTypeSimple>()) SynTypeSimple(start, ctx.Previous(), namespacePath, name);
	}

	if(ctx.Consume(lex_auto))
		return new (ctx.get<SynTypeAuto>()) SynTypeAuto(start, ctx.Previous());

	if(ctx.Consume(lex_generic))
		return new (ctx.get<SynTypeGeneric>()) SynTypeGeneric(start, ctx.Previous());

	if(ctx.Consume(lex_typeof))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: typeof must be followed by '('");

		SynBase *value = ParseAssignment(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after typeof(");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after expression in typeof");

		SynBase *node = new (ctx.get<SynTypeof>()) SynTypeof(start, ctx.Previous(), value);

		return ParsePostExpressions(ctx, node);
	}

	if(ctx.Consume(lex_at))
	{
		if(!ctx.At(lex_string))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		return new (ctx.get<SynTypeAlias>()) SynTypeAlias(start, ctx.Previous(), nameIdentifier);
	}

	return NULL;
}